

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastGtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  ParseContext *pPVar3;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  int iVar12;
  char *pcVar13;
  uint *puVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar15;
  FieldAux *pFVar16;
  MessageLite *pMVar17;
  EpsCopyInputStream *this;
  TailCallParseFunc p_Var18;
  EpsCopyInputStream *pEVar19;
  LogMessage *pLVar20;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_class_24_3_cc722eaf inner_loop;
  TcParseTableBase *inner_table;
  FieldAux aux;
  MessageLite **field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_180;
  uchar saved_tag;
  uint64_t local_178;
  TcParseTableBase *local_170;
  ParseContext *local_168;
  char *local_160;
  MessageLite *local_158;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150 [2];
  uint local_13c;
  TcParseTableBase *pTStack_138;
  uint32_t has_bits_offset;
  ulong local_130;
  MessageLite *local_128;
  Arena *local_120;
  TcParseTableBase *local_118;
  LogMessage local_110;
  Voidify local_f9;
  Nullable<const_char_*> local_f8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_d9;
  Nullable<const_char_*> local_d8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_bc;
  char *local_b8;
  ParseContext *local_b0;
  char *local_a8;
  char *local_a0;
  TcFieldData *local_98;
  TcFieldData local_90;
  EpsCopyInputStream *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_178 = hasbits;
  local_170 = table;
  local_168 = ctx;
  local_160 = ptr;
  local_158 = msg;
  local_150[0] = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)local_150);
  pMVar17 = local_158;
  pcVar13 = local_160;
  pPVar2 = local_168;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe80);
    pcVar13 = MiniParse(pMVar17,pcVar13,pPVar2,(TcFieldData)aStack_180,local_170,local_178);
    return pcVar13;
  }
  uVar4 = UnalignedLoad<unsigned_char>(local_160);
  local_160 = local_160 + 1;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)local_150);
  local_178 = 1L << (bVar5 & 0x3f) | local_178;
  local_128 = local_158;
  pTStack_138 = local_170;
  local_13c = (uint)local_170->has_bits_offset;
  local_130 = local_178;
  if (local_13c != 0) {
    uVar9 = (uint)local_178;
    puVar14 = RefAt<unsigned_int>(local_158,(ulong)local_13c);
    *puVar14 = uVar9 | *puVar14;
  }
  pMVar17 = local_158;
  uVar7 = TcFieldData::offset((TcFieldData *)local_150);
  aVar15 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::MessageLite*>(pMVar17,(ulong)uVar7);
  pTVar1 = local_170;
  bVar5 = TcFieldData::aux_idx((TcFieldData *)local_150);
  pFVar16 = TcParseTableBase::field_aux(pTVar1,(uint)bVar5);
  pTVar1 = pFVar16->table;
  inner_loop.inner_table = (TcParseTableBase **)pTVar1;
  if (*(MessageLite **)aVar15 == (MessageLite *)0x0) {
    local_120 = MessageLite::GetArena(local_158);
    local_118 = pTVar1;
    pMVar17 = ClassData::New(pTVar1->class_data,local_120);
    *(MessageLite **)aVar15 = pMVar17;
  }
  pcVar13 = local_160;
  pPVar2 = local_168;
  inner_loop.field = (MessageLite **)&local_168;
  inner_loop.ctx = (ParseContext **)&inner_loop.inner_table;
  data_local.field_0 = aVar15;
  local_bc = FastDecodeTag(uVar4);
  local_b0 = pPVar2;
  local_b8 = pcVar13;
  _old_group_depth = &data_local;
  iVar10 = pPVar2->depth_ + -1;
  pPVar2->depth_ = iVar10;
  if (iVar10 < 0) {
    local_a8 = (char *)0x0;
  }
  else {
    pPVar2->group_depth_ = pPVar2->group_depth_ + 1;
    absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
    absl_log_internal_check_op_result._0_4_ = pPVar2->group_depth_;
    local_a0 = pcVar13;
    local_70 = *(MessageLite **)data_local.field_0;
    local_80 = (ParseContext *)*inner_loop.field;
    local_78 = pcVar13;
    local_88 = (EpsCopyInputStream *)
               (((*inner_loop.ctx)->super_EpsCopyInputStream).patch_buffer_ + 0x10);
    local_98 = _old_group_depth;
    while (bVar6 = ParseContext::Done(local_80,&local_78), pMVar17 = local_70, pcVar13 = local_78,
          pPVar3 = local_80, ((bVar6 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_90);
      pEVar19 = local_88;
      this = (EpsCopyInputStream *)((long)local_88 + -0x38);
      uVar8 = UnalignedLoad<unsigned_short>(pcVar13);
      if (((long)(int)((uint)uVar8 & (uint)*(byte *)((long)pEVar19 + -0x30)) & 7U) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry
                     ((TcParseTableBase *)this,
                      (ulong)(long)(int)((uint)uVar8 & (uint)*(byte *)((long)pEVar19 + -0x30)) >> 3)
      ;
      local_58.data =
           (ulong)uVar8 ^
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data;
      p_Var18 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_60.data = local_58.data;
      local_78 = (*p_Var18)(pMVar17,pcVar13,pPVar3,(TcFieldData)local_58,(TcParseTableBase *)this,0)
      ;
      if ((local_78 == (char *)0x0) ||
         (uVar11 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar11 != 1))
      break;
    }
    pEVar19 = (EpsCopyInputStream *)((long)local_88 + -0x38);
    if ((*(byte *)((long)local_88 + -0x2f) & 1) == 0) {
      local_88 = pEVar19;
      if (local_78 == (char *)0x0) {
        VerifyHasBitConsistency(local_70,(TcParseTableBase *)pEVar19);
      }
      local_68 = local_78;
    }
    else {
      pcVar13 = (char *)((long)local_88 + -0x10);
      local_88 = pEVar19;
      local_68 = (char *)(**(code **)pcVar13)(local_70,local_78,local_80);
    }
    local_b8 = local_68;
    if (local_68 != (char *)0x0) {
      iVar10 = absl::lts_20250127::log_internal::GetReferenceableValue
                         (absl_log_internal_check_op_result._4_4_);
      iVar12 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->depth_);
      local_d8 = absl::lts_20250127::log_internal::Check_EQImpl(iVar10,iVar12,"old_depth == depth_")
      ;
      if (local_d8 != (Nullable<const_char_*>)0x0) {
        pcVar13 = absl::lts_20250127::implicit_cast<char_const*>(local_d8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x491,pcVar13);
        pLVar20 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&absl_log_internal_check_op_result_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_d9,pLVar20);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
      }
      iVar10 = absl::lts_20250127::log_internal::GetReferenceableValue
                         ((int)absl_log_internal_check_op_result);
      iVar12 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->group_depth_);
      local_f8 = absl::lts_20250127::log_internal::Check_EQImpl
                           (iVar10,iVar12,"old_group_depth == group_depth_");
      if (local_f8 != (Nullable<const_char_*>)0x0) {
        pcVar13 = absl::lts_20250127::implicit_cast<char_const*>(local_f8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_110,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x492,pcVar13);
        pLVar20 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_f9,pLVar20);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_110);
      }
      local_f8 = (Nullable<const_char_*>)0x0;
    }
    pPVar2->group_depth_ = pPVar2->group_depth_ + -1;
    pPVar2->depth_ = pPVar2->depth_ + 1;
    bVar6 = EpsCopyInputStream::ConsumeEndGroup(&pPVar2->super_EpsCopyInputStream,local_bc);
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      local_a8 = local_b8;
    }
    else {
      local_a8 = (char *)0x0;
    }
  }
  return local_a8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}